

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
insert<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,size_t pos,
          ArrayPtr<const_unsigned_char> *params)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  ulong uVar3;
  uchar *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  HashBucket *pHVar9;
  long lVar10;
  ulong uVar11;
  HashIndex<kj::_::HashSetCallbacks> *this_00;
  ArrayPtr<const_unsigned_char> *in_R9;
  ulong uVar12;
  HashBucket *pHVar13;
  bool bVar14;
  Maybe<unsigned_long> MVar15;
  
  this_00 = (HashIndex<kj::_::HashSetCallbacks> *)table.ptr;
  uVar3 = (this_00->buckets).size_ * 2;
  if (uVar3 < (this_00->erasedCount + pos) * 3 + 3) {
    uVar11 = pos * 2 + 2;
    if (uVar11 < uVar3) {
      uVar11 = uVar3;
    }
    rehash(this_00,uVar11);
  }
  uVar6 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*in_R9);
  uVar7 = kj::_::chooseBucket((uint)(uVar6 != 0),(uint)(this_00->buckets).size_);
  aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->buckets).ptr;
  pHVar9 = (HashBucket *)0x0;
  do {
    pHVar13 = (HashBucket *)(aVar2.value + (ulong)uVar7 * 8);
    uVar1 = pHVar13->value;
    if (uVar1 == 1) {
      if (pHVar9 == (HashBucket *)0x0) {
        pHVar9 = pHVar13;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar9 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar13 = pHVar9;
        }
        *pHVar13 = (HashBucket)(((ulong)(uVar6 != 0) | (long)params << 0x20) + 0x200000000);
        *(undefined1 *)this = 0;
        goto LAB_004092f1;
      }
      if (pHVar13->hash == (uint)(uVar6 != 0)) {
        lVar10 = (ulong)(uVar1 - 2) * 0x10;
        uVar3 = *(ulong *)(table.size_ + 8 + lVar10);
        if (uVar3 == in_R9->size_) {
          bVar14 = uVar3 == 0;
          if (!bVar14) {
            puVar4 = *(uchar **)(lVar10 + table.size_);
            if (*puVar4 != *in_R9->ptr) goto LAB_00409284;
            uVar11 = 0;
            do {
              uVar12 = uVar3;
              if (uVar3 - 1 == uVar11) break;
              lVar10 = uVar11 + 1;
              uVar12 = uVar11 + 1;
              lVar5 = uVar11 + 1;
              uVar11 = uVar12;
            } while (puVar4[lVar10] == in_R9->ptr[lVar5]);
            bVar14 = uVar3 <= uVar12;
          }
          if (bVar14) {
            *(undefined1 *)this = 1;
            this->erasedCount = (ulong)(uVar1 - 2);
LAB_004092f1:
            MVar15.ptr.field_1.value = aVar2.value;
            MVar15.ptr._0_8_ = this;
            return (Maybe<unsigned_long>)MVar15.ptr;
          }
        }
      }
    }
LAB_00409284:
    sVar8 = (ulong)uVar7 + 1;
    uVar7 = (uint)sVar8;
    if (sVar8 == (this_00->buckets).size_) {
      uVar7 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }